

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

PerThreadSynch * absl::Enqueue(PerThreadSynch *head,SynchWaitParams *waitp,intptr_t mu,int flags)

{
  atomic<long> *paVar1;
  ulong uVar2;
  int in_EAX;
  int c;
  uint uVar3;
  PerThreadSynch *pPVar4;
  int64_t iVar5;
  pthread_t __target_thread;
  PerThreadSynch *pPVar6;
  PerThreadSynch *pPVar7;
  PerThreadSynch *x;
  bool bVar8;
  double dVar9;
  sched_param param;
  int policy;
  
  paVar1 = waitp->cv_word;
  if (paVar1 != (atomic<long> *)0x0) {
    waitp->cv_word = (atomic<long> *)0x0;
    c = 0;
    do {
      uVar2 = (paVar1->super___atomic_base<long>)._M_i;
      if ((uVar2 & 1) == 0) {
        LOCK();
        bVar8 = uVar2 == (paVar1->super___atomic_base<long>)._M_i;
        if (bVar8) {
          (paVar1->super___atomic_base<long>)._M_i = uVar2 | 1;
        }
        UNLOCK();
        if (bVar8) {
          pPVar4 = waitp->thread;
          if (pPVar4->waitp != (SynchWaitParams *)0x0) {
            raw_logging_internal::RawLog
                      (kFatal,"mutex.cc",0x9e9,"Check %s failed: %s",
                       "waitp->thread->waitp == nullptr","waiting when shouldn\'t be");
            pPVar4 = waitp->thread;
          }
          pPVar4->waitp = waitp;
          pPVar6 = (PerThreadSynch *)(uVar2 & 0xfffffffffffffffc);
          pPVar7 = pPVar4;
          if (pPVar6 != (PerThreadSynch *)0x0) {
            pPVar4->next = pPVar6->next;
            pPVar7 = pPVar6;
          }
          pPVar7->next = pPVar4;
          (pPVar4->state)._M_i = kQueued;
          (paVar1->super___atomic_base<long>)._M_i = (ulong)((uint)uVar2 & 2) | (ulong)waitp->thread
          ;
          return head;
        }
      }
      c = synchronization_internal::MutexDelay(c,1);
    } while( true );
  }
  pPVar4 = waitp->thread;
  param.sched_priority = in_EAX;
  if ((pPVar4->waitp != waitp && pPVar4->waitp != (SynchWaitParams *)0x0) &&
     (pPVar4->suppress_fatal_errors == false)) {
    raw_logging_internal::RawLog
              (kFatal,"mutex.cc",0x387,"Check %s failed: %s",
               "s->waitp == nullptr || s->waitp == waitp || s->suppress_fatal_errors",
               "detected illegal recursion into Mutex code");
  }
  pPVar4->waitp = waitp;
  pPVar4->skip = (PerThreadSynch *)0x0;
  pPVar4->may_skip = true;
  pPVar4->wake = false;
  pPVar4->cond_waiter = (bool)((byte)flags >> 1 & 1);
  pPVar7 = pPVar4;
  if (head == (PerThreadSynch *)0x0) {
    pPVar4->next = pPVar4;
    pPVar4->readers = mu;
    pPVar4->maybe_unlocking = false;
    goto LAB_00139e6d;
  }
  iVar5 = base_internal::CycleClock::Now();
  if (pPVar4->next_priority_read_cycles < iVar5) {
    __target_thread = pthread_self();
    uVar3 = pthread_getschedparam(__target_thread,&policy,(sched_param *)&param);
    if (uVar3 == 0) {
      pPVar4->priority = param.sched_priority;
      dVar9 = base_internal::CycleClock::Frequency();
      pPVar4->next_priority_read_cycles = iVar5 + (long)dVar9;
    }
    else {
      raw_logging_internal::RawLog
                (kError,"mutex.cc",0x39e,"pthread_getschedparam failed: %d",(ulong)uVar3);
    }
  }
  bVar8 = head->maybe_unlocking;
  if (head->priority < pPVar4->priority) {
    pPVar6 = head;
    if ((bVar8 & 1U) == 0) {
      do {
        x = pPVar6;
        pPVar6 = Skip(x->next);
      } while (pPVar4->priority <= pPVar6->priority);
    }
    else if ((waitp->how != (MuHow)kExclusiveS) ||
            ((x = head, waitp->cond != (Condition *)0x0 &&
             (waitp->cond->eval_ != (_func_bool_Condition_ptr *)0x0)))) goto LAB_00139dbb;
    pPVar4->next = x->next;
    x->next = pPVar4;
    if ((x->skip != (PerThreadSynch *)0x0) && (bVar8 = MuEquivalentWaiter(x,pPVar4), !bVar8)) {
      raw_logging_internal::RawLog
                (kFatal,"mutex.cc",0x3cd,"Check %s failed: %s",
                 "enqueue_after->skip == nullptr || MuEquivalentWaiter(enqueue_after, s)",
                 "Mutex Enqueue failure");
    }
    if ((x != head) && (x->may_skip == true)) {
      pPVar7 = x->next;
      bVar8 = MuEquivalentWaiter(x,pPVar7);
      if (bVar8) {
        x->skip = pPVar7;
      }
    }
    pPVar6 = pPVar4->next;
    bVar8 = MuEquivalentWaiter(pPVar4,pPVar6);
    pPVar7 = head;
    if (bVar8) {
      pPVar4->skip = pPVar6;
    }
  }
  else {
LAB_00139dbb:
    pPVar4->next = head->next;
    head->next = pPVar4;
    pPVar4->readers = head->readers;
    pPVar4->maybe_unlocking = bVar8;
    if ((head->may_skip == true) && (bVar8 = MuEquivalentWaiter(head,pPVar4), bVar8)) {
      head->skip = pPVar4;
    }
  }
LAB_00139e6d:
  (pPVar4->state)._M_i = kQueued;
  return pPVar7;
}

Assistant:

static PerThreadSynch *Enqueue(PerThreadSynch *head,
                               SynchWaitParams *waitp, intptr_t mu, int flags) {
  // If we have been given a cv_word, call CondVarEnqueue() and return
  // the previous head of the Mutex waiter queue.
  if (waitp->cv_word != nullptr) {
    CondVarEnqueue(waitp);
    return head;
  }

  PerThreadSynch *s = waitp->thread;
  ABSL_RAW_CHECK(
      s->waitp == nullptr ||    // normal case
          s->waitp == waitp ||  // Fer()---transfer from condition variable
          s->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  s->waitp = waitp;
  s->skip = nullptr;             // maintain skip invariant (see above)
  s->may_skip = true;            // always true on entering queue
  s->wake = false;               // not being woken
  s->cond_waiter = ((flags & kMuIsCond) != 0);
  if (head == nullptr) {         // s is the only waiter
    s->next = s;                 // it's the only entry in the cycle
    s->readers = mu;             // reader count is from mu word
    s->maybe_unlocking = false;  // no one is searching an empty list
    head = s;                    // s is new head
  } else {
    PerThreadSynch *enqueue_after = nullptr;  // we'll put s after this element
#ifdef ABSL_HAVE_PTHREAD_GETSCHEDPARAM
    int64_t now_cycles = base_internal::CycleClock::Now();
    if (s->next_priority_read_cycles < now_cycles) {
      // Every so often, update our idea of the thread's priority.
      // pthread_getschedparam() is 5% of the block/wakeup time;
      // base_internal::CycleClock::Now() is 0.5%.
      int policy;
      struct sched_param param;
      const int err = pthread_getschedparam(pthread_self(), &policy, &param);
      if (err != 0) {
        ABSL_RAW_LOG(ERROR, "pthread_getschedparam failed: %d", err);
      } else {
        s->priority = param.sched_priority;
        s->next_priority_read_cycles =
            now_cycles +
            static_cast<int64_t>(base_internal::CycleClock::Frequency());
      }
    }
    if (s->priority > head->priority) {  // s's priority is above head's
      // try to put s in priority-fifo order, or failing that at the front.
      if (!head->maybe_unlocking) {
        // No unlocker can be scanning the queue, so we can insert into the
        // middle of the queue.
        //
        // Within a skip chain, all waiters have the same priority, so we can
        // skip forward through the chains until we find one with a lower
        // priority than the waiter to be enqueued.
        PerThreadSynch *advance_to = head;    // next value of enqueue_after
        do {
          enqueue_after = advance_to;
          // (side-effect: optimizes skip chain)
          advance_to = Skip(enqueue_after->next);
        } while (s->priority <= advance_to->priority);
              // termination guaranteed because s->priority > head->priority
              // and head is the end of a skip chain
      } else if (waitp->how == kExclusive &&
                 Condition::GuaranteedEqual(waitp->cond, nullptr)) {
        // An unlocker could be scanning the queue, but we know it will recheck
        // the queue front for writers that have no condition, which is what s
        // is, so an insert at front is safe.
        enqueue_after = head;       // add after head, at front
      }
    }
#endif
    if (enqueue_after != nullptr) {
      s->next = enqueue_after->next;
      enqueue_after->next = s;

      // enqueue_after can be: head, Skip(...), or cur.
      // The first two imply enqueue_after->skip == nullptr, and
      // the last is used only if MuEquivalentWaiter(s, cur).
      // We require this because clearing enqueue_after->skip
      // is impossible; enqueue_after's predecessors might also
      // incorrectly skip over s if we were to allow other
      // insertion points.
      ABSL_RAW_CHECK(enqueue_after->skip == nullptr ||
                         MuEquivalentWaiter(enqueue_after, s),
                     "Mutex Enqueue failure");

      if (enqueue_after != head && enqueue_after->may_skip &&
          MuEquivalentWaiter(enqueue_after, enqueue_after->next)) {
        // enqueue_after can skip to its new successor, s
        enqueue_after->skip = enqueue_after->next;
      }
      if (MuEquivalentWaiter(s, s->next)) {  // s->may_skip is known to be true
        s->skip = s->next;                // s may skip to its successor
      }
    } else {   // enqueue not done any other way, so
               // we're inserting s at the back
      // s will become new head; copy data from head into it
      s->next = head->next;        // add s after head
      head->next = s;
      s->readers = head->readers;  // reader count is from previous head
      s->maybe_unlocking = head->maybe_unlocking;  // same for unlock hint
      if (head->may_skip && MuEquivalentWaiter(head, s)) {
        // head now has successor; may skip
        head->skip = s;
      }
      head = s;  // s is new head
    }
  }
  s->state.store(PerThreadSynch::kQueued, std::memory_order_relaxed);
  return head;
}